

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

int __thiscall MemTable::remove(MemTable *this,char *__filename)

{
  char *pcVar1;
  size_t sVar2;
  uint7 extraout_var;
  size_t extraout_RAX;
  size_t sVar3;
  QuadListNode<SSTableDataEntry> *pred_node;
  Result RVar4;
  string local_50;
  
  RVar4 = skipSearch(this,(this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,(longlong)__filename);
  pred_node = RVar4.node;
  sVar2 = time((time_t *)0x0);
  sVar3 = sVar2;
  if (((undefined1  [16])RVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    _put(this,pred_node,(longlong)__filename,&local_50,true);
    sVar3 = (ulong)extraout_var << 8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      sVar3 = extraout_RAX;
    }
  }
  if ((char *)(pred_node->data).key == __filename) {
    if ((pred_node->data).delete_flag == false) {
      pcVar1 = (char *)(pred_node->data).value._M_string_length;
      this->_size_bytes = (this->_size_bytes - (long)pcVar1) - 0x19;
      std::__cxx11::string::_M_replace((ulong)&(pred_node->data).value,0,pcVar1,0x10d2ae);
      (pred_node->data).timestamp = sVar2;
      (pred_node->data).value_length = 0;
      sVar3 = (pred_node->data).value._M_string_length + this->_size_bytes + 0x19;
      this->_size_bytes = sVar3;
      do {
        (pred_node->data).delete_flag = true;
        pred_node = pred_node->above;
      } while (pred_node != (QuadListNode<SSTableDataEntry> *)0x0);
    }
    else {
      (pred_node->data).timestamp = sVar2;
    }
  }
  return (int)CONCAT71((int7)(sVar3 >> 8),1);
}

Assistant:

bool MemTable::remove(long long k) {
    auto[valid, to_delete] = skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k not found, as MemTable of a LSMTree, insert new tower marked as deleted.
        _put(to_delete, k, "", true);
    }
    if (to_delete->data.key == k && !to_delete->data.delete_flag) {
        // found k and has not been marked as deleted. mark deleted, remove value, update timestamp.
        _size_bytes -= size_of_node(to_delete);
        to_delete->data.value = "";
        to_delete->data.timestamp = timestamp;
        to_delete->data.value_length = 0;
        _size_bytes += size_of_node(to_delete);
        do {
            to_delete->data.delete_flag = true;
            to_delete = to_delete->above;
        } while (to_delete != nullptr);
        return true;
    }
    if (to_delete->data.key == k && to_delete->data.delete_flag) {
        // found k and its has been marked as deleted, just update timestamp.
        to_delete->data.timestamp = timestamp; // bytes level size don't change.
    }
    return true;
}